

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void GetOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyOptionId optId_00;
  TidyOptionType TVar1;
  TidyConfigCategory TVar2;
  Bool BVar3;
  ctmbstr ptVar4;
  ulong uVar5;
  uint idef;
  TidyOptionType optTyp;
  TidyOptionId optId;
  OptionDesc *d_local;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  optId_00 = tidyOptGetId(topt);
  TVar1 = tidyOptGetType(topt);
  ptVar4 = tidyOptGetName(topt);
  d->name = ptVar4;
  TVar2 = tidyOptGetCategory(topt);
  ptVar4 = ConfigCategoryId(TVar2);
  d->cat = ptVar4;
  TVar2 = tidyOptGetCategory(topt);
  d->catid = TVar2;
  d->vals = (ctmbstr)0x0;
  d->def = (ctmbstr)0x0;
  d->haveVals = yes;
  if (optId_00 != TidyBlockTags) {
    if (optId_00 == TidyCharEncoding) {
LAB_0012fefe:
      d->type = "Encoding";
      ptVar4 = tidyOptGetEncName(tdoc,optId_00);
      d->def = ptVar4;
      if (d->def == (ctmbstr)0x0) {
        d->def = anon_var_dwarf_15ce8 + 0x41;
      }
      d->vals = (ctmbstr)0x0;
      return;
    }
    if (optId_00 != TidyEmptyTags) {
      if (optId_00 == TidyInCharEncoding) goto LAB_0012fefe;
      if (optId_00 != TidyInlineTags) {
        if (optId_00 == TidyOutCharEncoding) goto LAB_0012fefe;
        if (optId_00 != TidyPreTags) {
          if (optId_00 == TidyPriorityAttributes) {
            d->type = "Attributes Names";
            d->vals = "attributeX, attributeY, ...";
            d->def = (ctmbstr)0x0;
            return;
          }
          if (TVar1 == TidyString) {
            d->type = "String";
            d->vals = (ctmbstr)0x0;
            d->haveVals = no;
            ptVar4 = tidyOptGetValue(tdoc,optId_00);
            d->def = ptVar4;
            return;
          }
          if (TVar1 == TidyInteger) {
            BVar3 = hasPickList(topt);
            if (BVar3 != no) {
              d->type = "Enum";
              ptVar4 = tidyOptGetCurrPick(tdoc,optId_00);
              d->def = ptVar4;
              return;
            }
            d->type = "Integer";
            if (optId_00 == TidyWrapLen) {
              d->vals = "0 (no wrapping), 1, 2, ...";
            }
            else {
              d->vals = "0, 1, 2, ...";
            }
            uVar5 = tidyOptGetInt(tdoc,optId_00);
            sprintf(d->tempdefs,"%u",uVar5 & 0xffffffff);
            d->def = d->tempdefs;
            return;
          }
          if (TVar1 != TidyBoolean) {
            return;
          }
          d->type = "Boolean";
          ptVar4 = tidyOptGetCurrPick(tdoc,optId_00);
          d->def = ptVar4;
          return;
        }
      }
    }
  }
  d->type = "Tag Names";
  d->vals = "tagX, tagY, ...";
  d->def = (ctmbstr)0x0;
  return;
}

Assistant:

static void GetOption(TidyDoc tdoc,    /**< The tidy document. */
                      TidyOption topt, /**< The option to create a description for. */
                      OptionDesc *d    /**< [out] The new option description. */
                      )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyOptionType optTyp = tidyOptGetType( topt );

    d->name = tidyOptGetName( topt );
    d->cat = ConfigCategoryId( tidyOptGetCategory( topt ) );
    d->catid = tidyOptGetCategory( topt );
    d->vals = NULL;
    d->def = NULL;
    d->haveVals = yes;

    /* Handle special cases first. */
    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
            d->type = "Tag Names";
            d->vals = "tagX, tagY, ...";
            d->def = NULL;
            break;

        case TidyPriorityAttributes:
            d->type = "Attributes Names";
            d->vals = "attributeX, attributeY, ...";
            d->def = NULL;
            break;
            
        case TidyCharEncoding:
        case TidyInCharEncoding:
        case TidyOutCharEncoding:
            d->type = "Encoding";
            d->def = tidyOptGetEncName( tdoc, optId );
            if (!d->def)
                d->def = "?";
            d->vals = NULL;
            break;
            
            /* General case will handle remaining */
        default:
            switch ( optTyp )
        {
            case TidyBoolean:
                d->type = "Boolean";
                d->def = tidyOptGetCurrPick( tdoc, optId );
                break;
                
            case TidyInteger:
                if (hasPickList(topt))
                {
                    d->type = "Enum";
                    d->def = tidyOptGetCurrPick( tdoc, optId );
                }
                else
                {
                    uint idef;
                    d->type = "Integer";
                    if ( optId == TidyWrapLen )
                        d->vals = "0 (no wrapping), 1, 2, ...";
                    else
                        d->vals = "0, 1, 2, ...";
                    
                    idef = tidyOptGetInt( tdoc, optId );
                    sprintf(d->tempdefs, "%u", idef);
                    d->def = d->tempdefs;
                }
                break;
                
            case TidyString:
                d->type = "String";
                d->vals = NULL;
                d->haveVals = no;
                d->def = tidyOptGetValue( tdoc, optId );
                break;
        }
    }
}